

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int patchtestreg(FuncState *fs,int node,int reg)

{
  uint uVar1;
  Instruction *pIVar2;
  int iVar3;
  Instruction IVar4;
  
  pIVar2 = getjumpcontrol(fs,node);
  uVar1 = *pIVar2;
  iVar3 = 0;
  if ((uVar1 & 0x3f) == 0x23) {
    if (uVar1 >> 0x17 == reg || reg == 0xff) {
      IVar4 = uVar1 & 0x7fc022 | uVar1 >> 0x11 & 0xffffffc0;
    }
    else {
      IVar4 = (reg & 0xffU) << 6 | uVar1 & 0xffffc023;
    }
    *pIVar2 = IVar4;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i))
    SETARG_A(*i, reg);
  else {
     /* no register to put value or register already has the value;
        change instruction to simple test */
    *i = CREATE_ABC(OP_TEST, GETARG_B(*i), 0, GETARG_C(*i));
  }
  return 1;
}